

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O1

void TransformColor_SSE2(VP8LMultipliers *m,uint32_t *argb_data,int num_pixels)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  auVar7 = _DAT_001b7180;
  uVar11 = 0;
  if (3 < num_pixels) {
    iVar8 = (int)(char)m->red_to_blue;
    auVar12._0_4_ = iVar8 << 0x13;
    auVar12._4_4_ = iVar8 << 0x13;
    auVar12._8_4_ = iVar8 << 0x13;
    auVar12._12_4_ = iVar8 << 0x13;
    iVar8 = (char)m->green_to_red * 0x80000 + ((int)(char)m->green_to_blue & 0x1fffU) * 8;
    auVar13._4_4_ = iVar8;
    auVar13._0_4_ = iVar8;
    auVar13._8_4_ = iVar8;
    auVar13._12_4_ = iVar8;
    uVar10 = 0;
    do {
      auVar2 = *(undefined1 (*) [16])(argb_data + uVar10);
      auVar14 = pshuflw(in_XMM4,auVar2,0xe8);
      auVar14 = pshufhw(auVar14,auVar14,0xe8);
      auVar24._0_4_ = auVar14._0_4_;
      auVar24._8_4_ = auVar14._8_4_;
      auVar24._12_4_ = auVar14._12_4_;
      auVar24._4_4_ = auVar24._8_4_;
      auVar14 = pshuflw(auVar24,auVar24,0xd8);
      auVar22._0_14_ = auVar14._0_14_;
      auVar22[0xe] = auVar14[7];
      auVar22[0xf] = auVar14[7];
      auVar21._14_2_ = auVar22._14_2_;
      auVar21._0_13_ = auVar14._0_13_;
      auVar21[0xd] = auVar14[6];
      auVar20._13_3_ = auVar21._13_3_;
      auVar20._0_12_ = auVar14._0_12_;
      auVar20[0xc] = auVar14[6];
      auVar19._12_4_ = auVar20._12_4_;
      auVar19._0_11_ = auVar14._0_11_;
      auVar19[0xb] = auVar14[5];
      auVar18._11_5_ = auVar19._11_5_;
      auVar18._0_10_ = auVar14._0_10_;
      auVar18[10] = auVar14[5];
      auVar17._10_6_ = auVar18._10_6_;
      auVar17._0_9_ = auVar14._0_9_;
      auVar17[9] = auVar14[4];
      auVar16._9_7_ = auVar17._9_7_;
      auVar16._0_8_ = auVar14._0_8_;
      auVar16[8] = auVar14[4];
      auVar15._8_8_ = auVar16._8_8_;
      auVar15[7] = auVar14[3];
      auVar15[6] = auVar14[3];
      auVar15[5] = auVar14[2];
      auVar15[4] = auVar14[2];
      auVar15[3] = auVar14[1];
      auVar15[2] = auVar14[1];
      auVar15[0] = auVar14[0];
      auVar15[1] = auVar15[0];
      auVar14 = pshuflw(auVar15,auVar15,0xe7);
      auVar14 = pshufhw(auVar14,auVar14,0xe7);
      auVar23._0_4_ = auVar14._0_4_;
      auVar23._8_4_ = auVar14._8_4_;
      auVar23._12_4_ = auVar14._12_4_;
      auVar23._4_4_ = auVar23._8_4_;
      auVar24 = pshuflw(auVar23,auVar23,0x8d);
      auVar4[10] = 0;
      auVar4._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar4[0xb] = auVar24[5];
      auVar5[9] = auVar24[4];
      auVar5._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar5._10_2_ = auVar4._10_2_;
      auVar6._9_3_ = auVar5._9_3_;
      auVar6._0_9_ = (unkuint9)0;
      auVar3._1_10_ = SUB1610(ZEXT516(CONCAT41(auVar6._8_4_,auVar24[3])) << 0x38,6);
      auVar3[0] = auVar24[2];
      auVar3._11_5_ = 0;
      auVar26._1_12_ = SUB1612(auVar3 << 0x28,4);
      auVar26[0] = auVar24[1];
      auVar26._13_3_ = 0;
      auVar14._1_14_ = SUB1614(auVar26 << 0x18,2);
      auVar14[0] = auVar24[0];
      auVar14[0xf] = 0;
      auVar26 = pmulhw(auVar14 << 8,auVar13);
      auVar14 = psllw(auVar2,8);
      auVar14 = pmulhw(auVar14,auVar12);
      auVar25[0] = auVar14[2] + auVar26[0];
      auVar25[1] = auVar14[3] + auVar26[1];
      auVar25[2] = auVar26[2];
      auVar25[3] = auVar26[3];
      auVar25[4] = auVar14[6] + auVar26[4];
      auVar25[5] = auVar14[7] + auVar26[5];
      auVar25[6] = auVar26[6];
      auVar25[7] = auVar26[7];
      auVar25[8] = auVar14[10] + auVar26[8];
      auVar25[9] = auVar14[0xb] + auVar26[9];
      auVar25[10] = auVar26[10];
      auVar25[0xb] = auVar26[0xb];
      auVar25[0xc] = auVar14[0xe] + auVar26[0xc];
      auVar25[0xd] = auVar14[0xf] + auVar26[0xd];
      auVar25[0xe] = auVar26[0xe];
      auVar25[0xf] = auVar26[0xf];
      in_XMM4 = auVar25 & auVar7;
      puVar1 = argb_data + uVar10;
      *(char *)puVar1 = auVar2[0] - in_XMM4[0];
      *(char *)((long)puVar1 + 1) = auVar2[1] - in_XMM4[1];
      *(char *)((long)puVar1 + 2) = auVar2[2] - in_XMM4[2];
      *(char *)((long)puVar1 + 3) = auVar2[3] - in_XMM4[3];
      *(char *)(puVar1 + 1) = auVar2[4] - in_XMM4[4];
      *(char *)((long)puVar1 + 5) = auVar2[5] - in_XMM4[5];
      *(char *)((long)puVar1 + 6) = auVar2[6] - in_XMM4[6];
      *(char *)((long)puVar1 + 7) = auVar2[7] - in_XMM4[7];
      *(char *)(puVar1 + 2) = auVar2[8] - in_XMM4[8];
      *(char *)((long)puVar1 + 9) = auVar2[9] - in_XMM4[9];
      *(char *)((long)puVar1 + 10) = auVar2[10] - in_XMM4[10];
      *(char *)((long)puVar1 + 0xb) = auVar2[0xb] - in_XMM4[0xb];
      *(char *)(puVar1 + 3) = auVar2[0xc] - in_XMM4[0xc];
      *(char *)((long)puVar1 + 0xd) = auVar2[0xd] - in_XMM4[0xd];
      *(char *)((long)puVar1 + 0xe) = auVar2[0xe] - in_XMM4[0xe];
      *(char *)((long)puVar1 + 0xf) = auVar2[0xf] - in_XMM4[0xf];
      uVar11 = uVar10 + 4;
      uVar9 = uVar10 + 8;
      uVar10 = uVar11;
    } while (uVar9 <= (uint)num_pixels);
  }
  iVar8 = num_pixels - (int)uVar11;
  if (iVar8 == 0) {
    return;
  }
  VP8LTransformColor_C(m,argb_data + (uVar11 & 0xffffffff),iVar8);
  return;
}

Assistant:

static void TransformColor_SSE2(const VP8LMultipliers* WEBP_RESTRICT const m,
                                uint32_t* WEBP_RESTRICT argb_data,
                                int num_pixels) {
  const __m128i mults_rb = MK_CST_16(CST_5b(m->green_to_red),
                                     CST_5b(m->green_to_blue));
  const __m128i mults_b2 = MK_CST_16(CST_5b(m->red_to_blue), 0);
  const __m128i mask_ag = _mm_set1_epi32((int)0xff00ff00);  // alpha-green masks
  const __m128i mask_rb = _mm_set1_epi32(0x00ff00ff);       // red-blue masks
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i in = _mm_loadu_si128((__m128i*)&argb_data[i]); // argb
    const __m128i A = _mm_and_si128(in, mask_ag);     // a   0   g   0
    const __m128i B = _mm_shufflelo_epi16(A, _MM_SHUFFLE(2, 2, 0, 0));
    const __m128i C = _mm_shufflehi_epi16(B, _MM_SHUFFLE(2, 2, 0, 0));  // g0g0
    const __m128i D = _mm_mulhi_epi16(C, mults_rb);    // x dr  x db1
    const __m128i E = _mm_slli_epi16(in, 8);           // r 0   b   0
    const __m128i F = _mm_mulhi_epi16(E, mults_b2);    // x db2 0   0
    const __m128i G = _mm_srli_epi32(F, 16);           // 0 0   x db2
    const __m128i H = _mm_add_epi8(G, D);              // x dr  x  db
    const __m128i I = _mm_and_si128(H, mask_rb);       // 0 dr  0  db
    const __m128i out = _mm_sub_epi8(in, I);
    _mm_storeu_si128((__m128i*)&argb_data[i], out);
  }
  // fallthrough and finish off with plain-C
  if (i != num_pixels) {
    VP8LTransformColor_C(m, argb_data + i, num_pixels - i);
  }
}